

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

string * __thiscall
enact::AstSerialise::visitReferenceExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,ReferenceExpr *expr)

{
  Expr *pEVar1;
  allocator<char> local_12a;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((expr->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    std::__cxx11::string::string
              ((string *)&local_108,
               (string *)
               &(expr->permission).super__Optional_base<enact::Token,_false,_false>._M_payload.
                super__Optional_payload<enact::Token,_true,_false,_false>.
                super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"",&local_129);
  }
  std::operator+(&local_c8,"(&",&local_108);
  std::operator+(&local_a8,&local_c8," ");
  if ((expr->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
      super__Optional_payload<enact::Token,_true,_false,_false>.
      super__Optional_payload_base<enact::Token>._M_engaged == true) {
    std::__cxx11::string::string
              ((string *)&local_128,
               (string *)
               &(expr->region).super__Optional_base<enact::Token,_false,_false>._M_payload.
                super__Optional_payload<enact::Token,_true,_false,_false>.
                super__Optional_payload_base<enact::Token>._M_payload._M_value.lexeme);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_12a);
  }
  std::operator+(&local_88,&local_a8,&local_128);
  std::operator+(&local_68,&local_88," ");
  pEVar1 = (expr->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
           super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (*pEVar1->_vptr_Expr[2])(&local_e8,pEVar1,&this->field_0x8);
  std::operator+(&local_48,&local_68,&local_e8);
  std::operator+(__return_storage_ptr__,&local_48,")");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitReferenceExpr(ReferenceExpr &expr) {
        return "(&" +
                (expr.permission ? expr.permission->lexeme : "") + " " +
                (expr.region ? expr.region->lexeme : "") + " " +
                visitExpr(*expr.expr) + ")";
    }